

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::setTilesNumeric(Fifteen *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  QPushButton *pQVar4;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  QString *pQVar7;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  long lVar9;
  QArrayDataPointer<char16_t> local_88;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *local_70;
  Fifteen *local_68;
  QString tileColor;
  QFont font;
  size_t nullValue;
  
  pvVar6 = Controller::getValues
                     ((this->controller)._M_t.
                      super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                      super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                      super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  Controller::getFontSize
            ((this->controller)._M_t.
             super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
             super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
             super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  QFont::QFont(&font);
  QFont::setPixelSize((int)&font);
  pQVar7 = Options::getTileColor();
  tileColor.d.d = (pQVar7->d).d;
  tileColor.d.ptr = (pQVar7->d).ptr;
  tileColor.d.size = (pQVar7->d).size;
  if (tileColor.d.d != (Data *)0x0) {
    LOCK();
    ((tileColor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((tileColor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = this;
  local_70 = TilesBoard::getTiles
                       ((this->tilesBoard)._M_t.
                        super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                        super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                        super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  puVar2 = (local_70->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (local_70->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar9 = 0;
      puVar1 = (pointer)((long)&(puVar2->_M_t).
                                super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>
                                ._M_t + lVar9), puVar1 != puVar3; lVar9 = lVar9 + 8) {
    pQVar4 = (puVar1->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
             _M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
             super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
    QString::number((ulong)&local_88,
                    (int)*(undefined8 *)
                          ((long)(pvVar6->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar9) + 1);
    QAbstractButton::setText((QString *)pQVar4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QWidget::setStyleSheet
              ((QString *)
               (puVar1->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
               _M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
               super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
    QWidget::setFont((QFont *)(puVar1->_M_t).
                              super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>
                              .super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
  }
  Controller::getNullValue
            ((local_68->controller)._M_t.
             super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
             super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
             super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    ((pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
  pvVar5 = local_70;
  pQVar7 = *(QString **)
            ((long)_Var8._M_current +
            ((long)(local_70->
                   super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start -
            (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start));
  local_88.d._0_4_ = 3;
  std::
  map<TileColor,_const_QString,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_const_QString>_>_>
  ::at(&Maps::tileColorStyle,(key_type *)&local_88);
  QWidget::setStyleSheet(pQVar7);
  pQVar7 = *(QString **)
            ((long)_Var8._M_current +
            ((long)(pvVar5->
                   super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start -
            (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start));
  QString::QString((QString *)&local_88,(char *)0x0);
  QAbstractButton::setText(pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&tileColor.d);
  QFont::~QFont(&font);
  return;
}

Assistant:

void Fifteen::setTilesNumeric()
{
    const auto& values = controller->getValues();

    size_t fontSize = controller->getFontSize();
    QFont font;
    font.setPixelSize( fontSize );
    auto tileColor = Options::getTileColor();

    auto& tiles = tilesBoard->getTiles();
    size_t valuesIndex = 0;
    for ( auto& tile : tiles )
    {
        tile->setText( QString::number( values[ valuesIndex++ ] + 1 ));
        tile->setStyleSheet( tileColor );
        tile->setFont( font );
    }

    size_t nullValue = controller->getNullValue();
    auto iter = std::find( values.begin(), values.end(), nullValue );
    tiles[ std::distance( values.begin(), iter )]->setStyleSheet( Maps::tileColorStyle.at( TileColor::EMPTY ));
    tiles[ std::distance( values.begin(), iter )]->setText( nullptr );
}